

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CursorParseRank(Fts5Config *pConfig,Fts5Cursor *pCsr,sqlite3_value *pRank)

{
  int iVar1;
  FuncDef *pFVar2;
  _func_void_void_ptr *local_40;
  char *zRankArgs;
  char *zRank;
  char *z;
  sqlite3_value *psStack_20;
  int rc;
  sqlite3_value *pRank_local;
  Fts5Cursor *pCsr_local;
  Fts5Config *pConfig_local;
  
  z._4_4_ = 0;
  if (pRank == (sqlite3_value *)0x0) {
    if (pConfig->zRank == (char *)0x0) {
      pCsr->zRank = "bm25";
      pCsr->zRankArgs = (char *)0x0;
    }
    else {
      pCsr->zRank = pConfig->zRank;
      pCsr->zRankArgs = pConfig->zRankArgs;
    }
  }
  else {
    psStack_20 = pRank;
    pRank_local = (sqlite3_value *)pCsr;
    pCsr_local = (Fts5Cursor *)pConfig;
    zRank = (char *)sqlite3_value_text(pRank);
    zRankArgs = (char *)0x0;
    local_40 = (_func_void_void_ptr *)0x0;
    if ((uchar *)zRank == (uchar *)0x0) {
      iVar1 = sqlite3_value_type(psStack_20);
      if (iVar1 == 5) {
        z._4_4_ = 1;
      }
    }
    else {
      z._4_4_ = sqlite3Fts5ConfigParseRank(zRank,&zRankArgs,(char **)&local_40);
    }
    if (z._4_4_ == 0) {
      pRank_local[1].db = (sqlite3 *)zRankArgs;
      pRank_local[1].xDel = local_40;
      *(uint *)&pRank_local[1].zMalloc = *(uint *)&pRank_local[1].zMalloc | 0x10;
    }
    else if (z._4_4_ == 1) {
      pFVar2 = (FuncDef *)sqlite3_mprintf("parse error in rank function: %s",zRank);
      ((pRank_local->u).pDef)->pNext = pFVar2;
    }
  }
  return z._4_4_;
}

Assistant:

static int fts5CursorParseRank(
  Fts5Config *pConfig,
  Fts5Cursor *pCsr, 
  sqlite3_value *pRank
){
  int rc = SQLITE_OK;
  if( pRank ){
    const char *z = (const char*)sqlite3_value_text(pRank);
    char *zRank = 0;
    char *zRankArgs = 0;

    if( z==0 ){
      if( sqlite3_value_type(pRank)==SQLITE_NULL ) rc = SQLITE_ERROR;
    }else{
      rc = sqlite3Fts5ConfigParseRank(z, &zRank, &zRankArgs);
    }
    if( rc==SQLITE_OK ){
      pCsr->zRank = zRank;
      pCsr->zRankArgs = zRankArgs;
      CsrFlagSet(pCsr, FTS5CSR_FREE_ZRANK);
    }else if( rc==SQLITE_ERROR ){
      pCsr->base.pVtab->zErrMsg = sqlite3_mprintf(
          "parse error in rank function: %s", z
      );
    }
  }else{
    if( pConfig->zRank ){
      pCsr->zRank = (char*)pConfig->zRank;
      pCsr->zRankArgs = (char*)pConfig->zRankArgs;
    }else{
      pCsr->zRank = (char*)FTS5_DEFAULT_RANK;
      pCsr->zRankArgs = 0;
    }
  }
  return rc;
}